

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_quads.cpp
# Opt level: O1

void __thiscall CLayerQuads::CLayerQuads(CLayerQuads *this)

{
  char *dst;
  
  (this->super_CLayer)._vptr_CLayer = (_func_int **)&PTR__CLayer_002153d0;
  (this->super_CLayer).m_Type = 0;
  dst = (this->super_CLayer).m_aName;
  str_copy(dst,"(invalid)",0xc);
  (this->super_CLayer).m_Readonly = false;
  (this->super_CLayer).m_Visible = true;
  (this->super_CLayer).m_SaveToMap = true;
  (this->super_CLayer).m_Flags = 0;
  (this->super_CLayer).m_pEditor = (CEditor *)0x0;
  (this->super_CLayer)._vptr_CLayer = (_func_int **)&PTR__CLayerQuads_00215320;
  (this->m_lQuads).list = (CQuad *)0x0;
  array<CQuad,_allocator_default<CQuad>_>::clear(&this->m_lQuads);
  (this->super_CLayer).m_Type = 3;
  str_copy(dst,"Quads",0xc);
  this->m_Image = -1;
  return;
}

Assistant:

CLayerQuads::CLayerQuads()
{
	m_Type = LAYERTYPE_QUADS;
	str_copy(m_aName, "Quads", sizeof(m_aName));
	m_Image = -1;
}